

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_factory.hpp
# Opt level: O0

log_level __thiscall
boost::runtime::value_interpreter<boost::unit_test::log_level,_true>::interpret
          (value_interpreter<boost::unit_test::log_level,_true> *this,cstring *param_name,
          cstring *source)

{
  bool bVar1;
  pointer ppVar2;
  format_error *in_RDX;
  basic_cstring<const_char> *in_RSI;
  const_iterator found;
  map<boost::unit_test::basic_cstring<const_char>,_boost::unit_test::log_level,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::log_level>_>_>
  *in_stack_fffffffffffffe68;
  basic_cstring<const_char> local_150;
  basic_cstring<const_char> *in_stack_fffffffffffffec0;
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>
  *in_stack_fffffffffffffec8;
  _Self local_28;
  _Self local_20 [4];
  
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<boost::unit_test::basic_cstring<const_char>,_boost::unit_test::log_level,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::log_level>_>_>
       ::find(in_stack_fffffffffffffe68,(key_type *)0x26fc98);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<boost::unit_test::basic_cstring<const_char>,_boost::unit_test::log_level,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::log_level>_>_>
       ::end(in_stack_fffffffffffffe68);
  bVar1 = std::operator!=(local_20,&local_28);
  if (!bVar1) {
    unit_test::basic_cstring<const_char>::basic_cstring(&local_150,in_RSI);
    format_error::format_error(in_RDX,(cstring *)&stack0xfffffffffffffec0);
    specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::operator<<
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::operator<<
              ((specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> *)
               in_RSI,(char *)in_RDX);
    specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::operator<<
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::operator<<
              ((specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> *)
               in_RSI,(char *)in_RDX);
    unit_test::ut_detail::throw_exception<boost::runtime::format_error>(in_RDX);
  }
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::log_level>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::log_level>_>
                         *)0x26fe15);
  return ppVar2->second;
}

Assistant:

EnumType        interpret( cstring param_name, cstring source ) const
    {
        typename std::map<cstring,EnumType>::const_iterator found = m_name_to_value.find( source );

        BOOST_TEST_I_ASSRT( found != m_name_to_value.end(),
                            format_error( param_name ) << source <<
                            " is not a valid enumeration value name for parameter " << param_name << "." );

        return found->second;
    }